

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O1

void print_tlpperf(tlpperf *t)

{
  char *pcVar1;
  char *pcVar2;
  
  puts("============ tlpperf ============");
  pcVar1 = inet_ntoa((in_addr)(t->remote).s_addr);
  printf("-r remote:              %s\n",pcVar1);
  pcVar1 = inet_ntoa((in_addr)(t->local).s_addr);
  printf("-l local:               %s\n",pcVar1);
  printf("-b requester:           %02x:%02x\n",(ulong)(t->requester >> 8),(ulong)t->requester & 0xff
        );
  putchar(10);
  printf("-d direction:           %s\n",direction_str[t->direction]);
  printf("-a DMA region:          %#lx\n",t->region_addr);
  printf("-s DMA region size:     %lu\n",t->region_size);
  printf("-L DMA length           %lu\n",t->dma_len);
  putchar(10);
  printf("-N nthreads:            %d\n",(ulong)(uint)t->nthreads);
  printf("-R how to split:        %s\n",split_str[t->split]);
  printf("-P pattern:             %s\n",pattern_str[t->pattern]);
  pcVar2 = "on";
  pcVar1 = "on";
  if (t->latency_mode == 0) {
    pcVar1 = "off";
  }
  printf("-M latency mode:        %s\n",pcVar1);
  putchar(10);
  printf("-c count:               %d\n",(ulong)(uint)t->count);
  printf("-i interval:            %d\n",(ulong)(uint)t->interval);
  printf("-t duration             %d\n",(ulong)(uint)t->duration);
  if (debug == '\0') {
    pcVar2 = "off";
  }
  printf("-D debug:               %s\n",pcVar2);
  puts("=================================");
  return;
}

Assistant:

void print_tlpperf(struct tlpperf *t)
{
	printf("============ tlpperf ============\n");
	printf("-r remote:              %s\n", inet_ntoa(t->remote));
	printf("-l local:               %s\n", inet_ntoa(t->local));
	printf("-b requester:           %02x:%02x\n",
	       (t->requester & 0xFF00) >> 8, t->requester & 0x00FF);

	printf("\n");
	printf("-d direction:           %s\n", direction_str[t->direction]);
	printf("-a DMA region:          %#lx\n", t->region_addr);
	printf("-s DMA region size:     %lu\n", t->region_size);
	printf("-L DMA length           %lu\n", t->dma_len);

	printf("\n");
	printf("-N nthreads:            %d\n", t->nthreads);
	printf("-R how to split:        %s\n", split_str[t->split]);
	printf("-P pattern:             %s\n", pattern_str[t->pattern]);
	printf("-M latency mode:        %s\n", t->latency_mode ? "on" : "off");

	printf("\n");
	printf("-c count:               %d\n", t->count);
	printf("-i interval:            %d\n", t->interval);
	printf("-t duration             %d\n", t->duration);
	printf("-D debug:               %s\n", debug ? "on" : "off");

	printf("=================================\n");
}